

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::get_eager_action_cost(search *sch,uint32_t idx,uint64_t n)

{
  uint uVar1;
  v_array<unsigned_int> *this;
  bool bVar2;
  size_t sVar3;
  ulong i_00;
  uint *puVar4;
  ulong in_RDX;
  uint in_ESI;
  search *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t last;
  size_t size;
  v_array<unsigned_int> heads;
  v_array<unsigned_int> *gold_heads;
  v_array<unsigned_int> *stack;
  v_array<unsigned_int> *action_loss;
  task_data *data;
  uint local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  v_array<unsigned_int> local_58;
  v_array<unsigned_int> *local_38;
  v_array<unsigned_int> *local_30;
  v_array<unsigned_int> *local_28;
  task_data *local_20;
  ulong local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_20 = Search::search::get_task_data<task_data>(in_RDI);
  local_28 = &local_20->action_loss;
  local_30 = &local_20->stack;
  local_38 = &local_20->gold_heads;
  local_58._begin = (local_20->heads)._begin;
  local_58._end = (local_20->heads)._end;
  local_58.end_array = (local_20->heads).end_array;
  local_58.erase_count = (local_20->heads).erase_count;
  sVar3 = v_array<unsigned_int>::size(local_30);
  if (sVar3 == 0) {
    local_84 = 0;
  }
  else {
    local_84 = v_array<unsigned_int>::last(local_30);
  }
  i_00 = (ulong)local_84;
  for (local_70 = 1; local_70 < 5; local_70 = local_70 + 1) {
    puVar4 = v_array<unsigned_int>::operator[](local_28,local_70);
    *puVar4 = 0;
  }
  bVar2 = v_array<unsigned_int>::empty(local_30);
  if (!bVar2) {
    for (local_78 = 0; this = local_38, local_78 < sVar3; local_78 = local_78 + 1) {
      puVar4 = v_array<unsigned_int>::operator[](local_30,local_78);
      puVar4 = v_array<unsigned_int>::operator[](this,(ulong)*puVar4);
      if (*puVar4 == local_c) {
        puVar4 = v_array<unsigned_int>::operator[](local_30,local_78);
        puVar4 = v_array<unsigned_int>::operator[](&local_58,(ulong)*puVar4);
        if (*puVar4 == 9999999) {
          puVar4 = v_array<unsigned_int>::operator[](local_28,1);
          *puVar4 = *puVar4 + 1;
          puVar4 = v_array<unsigned_int>::operator[](local_28,2);
          *puVar4 = *puVar4 + 1;
        }
      }
      if (local_c <= local_18) {
        puVar4 = v_array<unsigned_int>::operator[](local_38,(ulong)local_c);
        uVar1 = *puVar4;
        puVar4 = v_array<unsigned_int>::operator[](local_30,local_78);
        if (uVar1 == *puVar4) {
          puVar4 = v_array<unsigned_int>::operator[](local_30,local_78);
          if (*puVar4 != 0) {
            puVar4 = v_array<unsigned_int>::operator[](local_28,1);
            *puVar4 = *puVar4 + 1;
          }
          puVar4 = v_array<unsigned_int>::operator[](local_30,local_78);
          if (*puVar4 != i_00) {
            puVar4 = v_array<unsigned_int>::operator[](local_28,2);
            *puVar4 = *puVar4 + 1;
          }
        }
      }
    }
  }
  for (local_80 = (ulong)local_c; local_80 <= local_18 + 1; local_80 = local_80 + 1) {
    if ((local_80 <= local_18) &&
       (puVar4 = v_array<unsigned_int>::operator[](local_38,local_80), *puVar4 == i_00)) {
      puVar4 = v_array<unsigned_int>::operator[](local_28,4);
      *puVar4 = *puVar4 + 1;
      puVar4 = v_array<unsigned_int>::operator[](local_28,3);
      *puVar4 = *puVar4 + 1;
    }
    if ((local_80 != local_c) &&
       (puVar4 = v_array<unsigned_int>::operator[](local_38,i_00), *puVar4 == local_80)) {
      puVar4 = v_array<unsigned_int>::operator[](local_28,3);
      *puVar4 = *puVar4 + 1;
    }
  }
  puVar4 = v_array<unsigned_int>::operator[](local_38,(ulong)local_c);
  if ((local_c < *puVar4) ||
     (((puVar4 = v_array<unsigned_int>::operator[](local_38,(ulong)local_c), *puVar4 == 0 &&
       (sVar3 != 0)) && (puVar4 = v_array<unsigned_int>::operator[](local_30,0), *puVar4 != 0)))) {
    puVar4 = v_array<unsigned_int>::operator[](local_28,2);
    *puVar4 = *puVar4 + 1;
  }
  return;
}

Assistant:

void get_eager_action_cost(Search::search &sch, uint32_t idx, uint64_t n)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &action_loss = data->action_loss, &stack = data->stack, &gold_heads = data->gold_heads,
                    heads = data->heads;
  size_t size = stack.size();
  size_t last = (size == 0) ? 0 : stack.last();
  for (size_t i = 1; i <= 4; i++) action_loss[i] = 0;
  if (!stack.empty())
    for (size_t i = 0; i < size; i++)
    {
      if (gold_heads[stack[i]] == idx && heads[stack[i]] == my_null)
      {
        action_loss[SHIFT] += 1;
        action_loss[REDUCE_RIGHT] += 1;
      }
      if (idx <= n && (gold_heads[idx] == stack[i]))
      {
        if (stack[i] != 0)
          action_loss[SHIFT] += 1;
        if (stack[i] != last)
          action_loss[REDUCE_RIGHT] += 1;
      }
    }
  for (size_t i = idx; i <= n + 1; i++)
  {
    if (i <= n && gold_heads[i] == last)
    {
      action_loss[REDUCE] += 1;
      action_loss[REDUCE_LEFT] += 1;
    }
    if (i != idx && gold_heads[last] == i)
      action_loss[REDUCE_LEFT] += 1;
  }
  // if(size>0  && idx <=n && gold_heads[last] == 0 && stack[0] ==0) //should not fire
  //  action_loss[REDUCE_LEFT] +=1;

  if (gold_heads[idx] > idx || (gold_heads[idx] == 0 && size > 0 && stack[0] != 0))
    action_loss[REDUCE_RIGHT] += 1;
}